

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::AnalyzeTapScriptTree
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::AnalyzeTapScriptTreeInfoStruct_(const_cfd::js::api::AnalyzeTapScriptTreeRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::AnalyzeTapScriptTreeInfoStruct(cfd::js::api::AnalyzeTapScriptTreeRequestStruct_const&)>
  ::
  function<cfd::js::api::AnalyzeTapScriptTreeInfoStruct(&)(cfd::js::api::AnalyzeTapScriptTreeRequestStruct_const&),void>
            ((function<cfd::js::api::AnalyzeTapScriptTreeInfoStruct(cfd::js::api::AnalyzeTapScriptTreeRequestStruct_const&)>
              *)&local_38,AddressStructApi::AnalyzeTapScriptTree);
  ExecuteJsonApi<cfd::js::api::json::AnalyzeTapScriptTreeRequest,cfd::js::api::json::AnalyzeTapScriptTreeInfo,cfd::js::api::AnalyzeTapScriptTreeRequestStruct,cfd::js::api::AnalyzeTapScriptTreeInfoStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::AnalyzeTapScriptTreeInfoStruct_(const_cfd::js::api::AnalyzeTapScriptTreeRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::AnalyzeTapScriptTree(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::AnalyzeTapScriptTreeRequest,
      api::json::AnalyzeTapScriptTreeInfo,
      api::AnalyzeTapScriptTreeRequestStruct,
      api::AnalyzeTapScriptTreeInfoStruct>(
      request_message, AddressStructApi::AnalyzeTapScriptTree);
}